

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionProxy::SetAuxPtr(FunctionProxy *this,AuxPointerType e,void *ptr)

{
  code *pcVar1;
  bool bVar2;
  ThreadContext *pTVar3;
  CCLock *this_00;
  undefined4 *puVar4;
  void *pvVar5;
  ScriptContext *this_01;
  CriticalSection *cs;
  AutoCriticalSection local_28;
  AutoCriticalSection autoCS;
  void *ptr_local;
  AuxPointerType e_local;
  FunctionProxy *this_local;
  
  autoCS.cs = (CriticalSection *)ptr;
  pTVar3 = ThreadContext::GetContextForCurrentThread();
  if (pTVar3 == (ThreadContext *)0x0) {
    this_00 = &ThreadContext::GetCriticalSection()->super_CCLock;
    bVar2 = CCLock::IsLocked(this_00);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x8b,
                                  "(ThreadContext::GetContextForCurrentThread() || ThreadContext::GetCriticalSection()->IsLocked())"
                                  ,
                                  "ThreadContext::GetContextForCurrentThread() || ThreadContext::GetCriticalSection()->IsLocked()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  if ((autoCS.cs != (CriticalSection *)0x0) || (pvVar5 = GetAuxPtr(this,e), pvVar5 != (void *)0x0))
  {
    this_01 = GetScriptContext(this);
    pTVar3 = ScriptContext::GetThreadContext(this_01);
    cs = ThreadContext::GetFunctionBodyLock(pTVar3);
    AutoCriticalSection::AutoCriticalSection(&local_28,cs);
    AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::SetAuxPtr(this,e,autoCS.cs);
    AutoCriticalSection::~AutoCriticalSection(&local_28);
  }
  return;
}

Assistant:

void FunctionProxy::SetAuxPtr(AuxPointerType e, void* ptr)
    {
        // On process detach this can be called from another thread but the ThreadContext should be locked
        Assert(ThreadContext::GetContextForCurrentThread() || ThreadContext::GetCriticalSection()->IsLocked());

        if (ptr == nullptr && GetAuxPtr(e) == nullptr)
        {
            return;
        }

        // when setting ptr to null we never need to promote
        AutoCriticalSection autoCS(this->GetScriptContext()->GetThreadContext()->GetFunctionBodyLock());
        AuxPtrsT::SetAuxPtr(this, e, ptr);
    }